

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O3

void __thiscall Inferences::URResolution::detach(URResolution *this)

{
  bool bVar1;
  
  this->_unitIndex = (UnitClauseLiteralIndex *)0x0;
  this->_nonUnitIndex = (NonUnitClauseLiteralIndex *)0x0;
  bVar1 = *(int *)(Lib::env + 0x8898) == 2;
  Indexing::IndexManager::release
            ((((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
               super_InferenceEngine._salg)->_imgr)._obj,bVar1 + URR_UNIT_CLAUSE_SUBST_TREE);
  Indexing::IndexManager::release
            ((((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
               super_InferenceEngine._salg)->_imgr)._obj,bVar1 | URR_NON_UNIT_CLAUSE_SUBST_TREE);
  (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.super_InferenceEngine
  ._salg = (SaturationAlgorithm *)0x0;
  return;
}

Assistant:

void URResolution::detach()
{
  _unitIndex = 0;
  _nonUnitIndex = 0;
  if (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS) {
    _salg->getIndexManager()->release(URR_UNIT_CLAUSE_WITH_AL_SUBST_TREE);
    _salg->getIndexManager()->release(URR_NON_UNIT_CLAUSE_WITH_AL_SUBST_TREE);
  } else {
    _salg->getIndexManager()->release(URR_UNIT_CLAUSE_SUBST_TREE);
    _salg->getIndexManager()->release(URR_NON_UNIT_CLAUSE_SUBST_TREE);
  }
  GeneratingInferenceEngine::detach();
}